

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall libtorrent::aux::torrent::debug_log(torrent *this,char *fmt,...)

{
  char in_AL;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 in_RCX;
  pointer in_RDX;
  __uniq_ptr_data<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>,_true,_true>
  in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_XMM4_Qa;
  element_type *in_XMM5_Qa;
  int64_t in_XMM6_Qa;
  int64_t in_XMM7_Qa;
  va_list v;
  undefined1 local_100 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  undefined1 *local_d8;
  undefined1 local_c8 [16];
  pointer local_b8;
  undefined8 local_b0;
  __uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
  local_a8;
  peer_class_set local_a0;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_58;
  element_type *local_48;
  int64_t local_38;
  int64_t local_28;
  
  if (in_AL != '\0') {
    local_a0.m_class.
    super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
    ._M_elems._4_8_ = in_XMM0_Qa;
    local_a0.m_class.
    super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
    ._M_elems._20_8_ = in_XMM1_Qa;
    local_a0.m_class.
    super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
    ._M_elems._36_8_ = in_XMM2_Qa;
    local_a0.m_class.
    super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
    ._M_elems._52_8_ = in_XMM3_Qa;
    local_58._M_pi = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_100._16_8_ = fmt;
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8._M_t.
  super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
  .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl =
       (tuple<libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>)
       (tuple<libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>)
       in_R8.
       super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
       ._M_t.
       super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
       .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl;
  local_a0._0_8_ = in_R9;
  iVar1 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [5])();
  if ((*(uint *)(CONCAT44(extraout_var,iVar1) + 0x68) >> 0xe & 1) != 0) {
    local_d8 = local_c8;
    local_e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&stack0x00000008;
    local_100._24_8_ = (element_type *)0x3000000010;
    iVar1 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    get_handle((torrent *)local_100);
    alert_manager::
    emplace_alert<libtorrent::torrent_log_alert,libtorrent::torrent_handle,char_const*&,__va_list_tag(&)[1]>
              ((alert_manager *)CONCAT44(extraout_var_00,iVar1),(torrent_handle *)local_100,
               (char **)(local_100 + 0x10),(__va_list_tag (*) [1])(local_100 + 0x18));
    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_100 + 8));
  }
  return;
}

Assistant:

void torrent::debug_log(char const* fmt, ...) const noexcept try
	{
		if (!alerts().should_post<torrent_log_alert>()) return;

		va_list v;
		va_start(v, fmt);
		alerts().emplace_alert<torrent_log_alert>(
			const_cast<torrent*>(this)->get_handle(), fmt, v);
		va_end(v);
	}
	catch (std::exception const&) {}